

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# document.h
# Opt level: O2

bool glTF::anon_unknown_59::ReadHelper<float[4]>::Read(Value *val,float (*out) [4])

{
  bool bVar1;
  SizeType SVar2;
  GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
  *pGVar3;
  uint i;
  long lVar4;
  double dVar5;
  
  if ((val->data_).f.flags == 4) {
    SVar2 = rapidjson::
            GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
            ::Size(val);
    if (SVar2 == 4) {
      for (lVar4 = 0; lVar4 != 4; lVar4 = lVar4 + 1) {
        pGVar3 = rapidjson::
                 GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                 ::operator[](val,(SizeType)lVar4);
        if ((undefined1  [16])((undefined1  [16])pGVar3->data_ & (undefined1  [16])0x10000000000000)
            != (undefined1  [16])0x0) {
          pGVar3 = rapidjson::
                   GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                   ::operator[](val,(SizeType)lVar4);
          dVar5 = rapidjson::
                  GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                  ::GetDouble(pGVar3);
          (*out)[lVar4] = (float)dVar5;
        }
      }
      bVar1 = true;
    }
    else {
      bVar1 = false;
    }
    return bVar1;
  }
  return false;
}

Assistant:

bool IsArray()  const { return data_.f.flags == kArrayFlag; }